

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O1

void y4m_convert_42xpaldv_42xjpeg(y4m_input *_y4m,uchar *_dst,uchar *_aux)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int _c_h;
  byte *pbVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  byte *_dst_00;
  long lVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  uint _c_w;
  int iVar25;
  uchar *puVar26;
  uchar *local_b8;
  
  iVar1 = _y4m->pic_w;
  _c_w = (iVar1 - (iVar1 + 1 >> 0x1f)) + 1 >> 1;
  uVar2 = (long)(_y4m->pic_h + _y4m->dst_c_dec_h + -1) / (long)_y4m->dst_c_dec_h;
  _c_h = (int)uVar2;
  iVar14 = _c_h * _c_w;
  uVar12 = 2;
  if (_c_h < 2) {
    uVar12 = uVar2 & 0xffffffff;
  }
  iVar25 = _c_h + -1;
  uVar10 = 3;
  if (_c_h < 3) {
    uVar10 = uVar2 & 0xffffffff;
  }
  lVar13 = (long)(int)_c_w;
  uVar8 = 1;
  if (1 < (int)_c_w) {
    uVar8 = _c_w;
  }
  iVar7 = 1;
  _dst_00 = _aux + iVar14 * 2;
  local_b8 = _dst + _y4m->pic_h * iVar1;
  do {
    y4m_42xmpeg2_42xjpeg_helper(_dst_00,_aux,_c_w,_c_h);
    if (iVar7 == 1) {
      pbVar6 = _dst_00;
      puVar26 = local_b8;
      if (0 < iVar1) {
        lVar24 = 0;
        do {
          if (_c_h < 1) {
            uVar15 = 0;
          }
          else {
            lVar17 = 0;
            uVar15 = 0;
            do {
              iVar22 = (int)uVar15;
              iVar9 = 1;
              if (1 < iVar22) {
                iVar9 = iVar22;
              }
              uVar15 = uVar15 + 1;
              iVar20 = iVar25;
              if ((int)uVar15 < iVar25) {
                iVar20 = (int)uVar15;
              }
              iVar3 = iVar22 + 2;
              if (iVar25 <= iVar22 + 2) {
                iVar3 = iVar25;
              }
              iVar9 = (int)((uint)pbVar6[(int)((iVar9 + -1) * _c_w)] * 0x23 + (uint)*pbVar6 * -8 +
                            (uint)pbVar6[lVar17] * 0x72 + (uint)pbVar6[(int)(iVar20 * _c_w)] * -0x11
                            + (uint)pbVar6[(int)(iVar3 * _c_w)] * 4 + 0x40) >> 7;
              if (0xfe < iVar9) {
                iVar9 = 0xff;
              }
              if (iVar9 < 1) {
                iVar9 = 0;
              }
              puVar26[lVar17] = (uchar)iVar9;
              lVar17 = lVar17 + (ulong)_c_w;
            } while (uVar10 != uVar15);
          }
          if ((int)uVar15 < (int)(_c_h - 2U)) {
            uVar15 = uVar15 & 0xffffffff;
            lVar18 = lVar13 * uVar15;
            lVar21 = (uVar15 - 3) * lVar13;
            lVar17 = lVar24;
            do {
              lVar11 = lVar17 + lVar21;
              lVar19 = lVar13 + lVar11;
              lVar4 = lVar13 + lVar19;
              lVar5 = lVar13 + lVar4;
              iVar9 = (int)((uint)_dst_00[lVar13 + lVar4] * 0x72 +
                            (uint)_dst_00[lVar13 + lVar19] * 0x23 +
                            ((uint)_dst_00[lVar17 + lVar21] -
                            ((uint)_dst_00[lVar13 + lVar11] + (uint)_dst_00[lVar13 + lVar11] * 8)) +
                            (uint)_dst_00[lVar13 + lVar5] * -0x11 +
                            (uint)_dst_00[lVar13 * 2 + lVar5] * 4 + 0x40) >> 7;
              if (0xfe < iVar9) {
                iVar9 = 0xff;
              }
              if (iVar9 < 1) {
                iVar9 = 0;
              }
              uVar15 = uVar15 + 1;
              local_b8[lVar17 + lVar18] = (uchar)iVar9;
              lVar17 = lVar17 + lVar13;
            } while (_c_h - 2U != uVar15);
          }
          if ((int)uVar15 < _c_h) {
            uVar15 = uVar15 & 0xffffffff;
            lVar19 = lVar13 * uVar15;
            lVar17 = uVar15 - 3;
            lVar18 = uVar15 - 2;
            lVar21 = uVar15 - 1;
            lVar11 = lVar24;
            do {
              uVar15 = uVar15 + 1;
              iVar9 = iVar25;
              if ((int)uVar15 < iVar25) {
                iVar9 = (int)uVar15;
              }
              iVar9 = (int)(((uint)_dst_00[lVar11 + lVar17 * lVar13] -
                            ((uint)_dst_00[lVar11 + lVar18 * lVar13] +
                            (uint)_dst_00[lVar11 + lVar18 * lVar13] * 8)) +
                            (uint)_dst_00[lVar11 + lVar21 * lVar13] * 0x23 +
                            (uint)_dst_00[lVar11 + lVar19] * 0x72 +
                            (uint)pbVar6[(int)(iVar9 * _c_w)] * -0x11 +
                            (uint)pbVar6[(int)(iVar25 * _c_w)] * 4 + 0x40) >> 7;
              if (0xfe < iVar9) {
                iVar9 = 0xff;
              }
              if (iVar9 < 1) {
                iVar9 = 0;
              }
              local_b8[lVar11 + lVar19] = (uchar)iVar9;
              lVar11 = lVar11 + lVar13;
            } while ((uVar2 & 0xffffffff) != uVar15);
          }
          puVar26 = puVar26 + 1;
          pbVar6 = pbVar6 + 1;
          lVar24 = lVar24 + 1;
        } while ((uint)lVar24 != uVar8);
      }
      pbVar6 = pbVar6 + (int)-_c_w;
      puVar26 = puVar26 + (int)(iVar14 - _c_w);
    }
    else {
      pbVar6 = _dst_00;
      puVar26 = local_b8;
      if (0 < iVar1) {
        lVar24 = 0;
        do {
          if (_c_h < 1) {
            uVar15 = 0;
          }
          else {
            lVar17 = 0;
            uVar16 = 0;
            do {
              uVar15 = uVar16 + 1;
              iVar9 = iVar25;
              if ((int)uVar15 < iVar25) {
                iVar9 = (int)uVar15;
              }
              iVar22 = (int)uVar16 + 2;
              if (iVar25 <= iVar22) {
                iVar22 = iVar25;
              }
              iVar20 = (int)uVar16 + 3;
              if (iVar25 <= iVar20) {
                iVar20 = iVar25;
              }
              iVar9 = (int)((((uint)pbVar6[lVar17] * 0x72 + (uint)*pbVar6 * -0xd +
                             (uint)pbVar6[(int)(iVar9 * _c_w)] * 0x23) -
                            ((uint)pbVar6[(int)(iVar22 * _c_w)] +
                            (uint)pbVar6[(int)(iVar22 * _c_w)] * 8)) +
                            (uint)pbVar6[(int)(iVar20 * _c_w)] + 0x40) >> 7;
              if (0xfe < iVar9) {
                iVar9 = 0xff;
              }
              if (iVar9 < 1) {
                iVar9 = 0;
              }
              puVar26[lVar17] = (uchar)iVar9;
              lVar17 = lVar17 + (ulong)_c_w;
              uVar16 = uVar15;
            } while (uVar12 != uVar15);
          }
          if ((int)uVar15 < (int)(_c_h - 3U)) {
            uVar15 = uVar15 & 0xffffffff;
            lVar18 = lVar13 * uVar15;
            lVar21 = (uVar15 - 2) * lVar13;
            lVar17 = lVar24;
            do {
              lVar11 = lVar17 + lVar21;
              lVar19 = lVar13 + lVar11;
              lVar4 = lVar13 + lVar19;
              lVar5 = lVar13 + lVar4;
              iVar9 = (int)((uint)_dst_00[lVar13 * 2 + lVar5] +
                            (((uint)_dst_00[lVar13 + lVar4] * 0x23 +
                             (uint)_dst_00[lVar13 + lVar19] * 0x72 +
                             (uint)_dst_00[lVar17 + lVar21] * 4 +
                             (uint)_dst_00[lVar13 + lVar11] * -0x11) -
                            ((uint)_dst_00[lVar13 + lVar5] + (uint)_dst_00[lVar13 + lVar5] * 8)) +
                           0x40) >> 7;
              if (0xfe < iVar9) {
                iVar9 = 0xff;
              }
              if (iVar9 < 1) {
                iVar9 = 0;
              }
              uVar15 = uVar15 + 1;
              local_b8[lVar17 + lVar18] = (uchar)iVar9;
              lVar17 = lVar17 + lVar13;
            } while (_c_h - 3U != uVar15);
          }
          if ((int)uVar15 < _c_h) {
            uVar15 = uVar15 & 0xffffffff;
            uVar16 = uVar15;
            lVar17 = lVar24;
            do {
              uVar23 = uVar16 + 1;
              iVar9 = iVar25;
              if ((int)uVar23 < iVar25) {
                iVar9 = (int)uVar23;
              }
              iVar22 = (int)uVar16 + 2;
              if (iVar25 <= iVar22) {
                iVar22 = iVar25;
              }
              iVar9 = (int)((((uint)_dst_00[lVar17 + (uVar15 - 2) * lVar13] * 4 +
                              (uint)_dst_00[lVar17 + (uVar15 - 1) * lVar13] * -0x11 +
                              (uint)_dst_00[lVar17 + lVar13 * uVar15] * 0x72 +
                             (uint)pbVar6[(int)(iVar9 * _c_w)] * 0x23) -
                            ((uint)pbVar6[(int)(iVar22 * _c_w)] +
                            (uint)pbVar6[(int)(iVar22 * _c_w)] * 8)) +
                            (uint)pbVar6[(int)(iVar25 * _c_w)] + 0x40) >> 7;
              if (0xfe < iVar9) {
                iVar9 = 0xff;
              }
              if (iVar9 < 1) {
                iVar9 = 0;
              }
              local_b8[lVar17 + lVar13 * uVar15] = (uchar)iVar9;
              lVar17 = lVar17 + lVar13;
              uVar16 = uVar23;
            } while ((uVar2 & 0xffffffff) != uVar23);
          }
          puVar26 = puVar26 + 1;
          pbVar6 = pbVar6 + 1;
          lVar24 = lVar24 + 1;
        } while ((uint)lVar24 != uVar8);
      }
    }
    _aux = _aux + iVar14;
    iVar7 = iVar7 + 1;
    _dst_00 = pbVar6;
    local_b8 = puVar26;
  } while (iVar7 != 3);
  return;
}

Assistant:

static void y4m_convert_42xpaldv_42xjpeg(y4m_input *_y4m, unsigned char *_dst,
                                         unsigned char *_aux) {
  unsigned char *tmp;
  int c_w;
  int c_h;
  int c_sz;
  int pli;
  int y;
  int x;
  /*Skip past the luma data.*/
  _dst += _y4m->pic_w * _y4m->pic_h;
  /*Compute the size of each chroma plane.*/
  c_w = (_y4m->pic_w + 1) / 2;
  c_h = (_y4m->pic_h + _y4m->dst_c_dec_h - 1) / _y4m->dst_c_dec_h;
  c_sz = c_w * c_h;
  tmp = _aux + 2 * c_sz;
  for (pli = 1; pli < 3; pli++) {
    /*First do the horizontal re-sampling.
      This is the same as the mpeg2 case, except that after the horizontal
       case, we need to apply a second vertical filter.*/
    y4m_42xmpeg2_42xjpeg_helper(tmp, _aux, c_w, c_h);
    _aux += c_sz;
    switch (pli) {
      case 1: {
        /*Slide C_b up a quarter-pel.
          This is the same filter used above, but in the other order.*/
        for (x = 0; x < c_w; x++) {
          for (y = 0; y < OC_MINI(c_h, 3); y++) {
            _dst[y * c_w] = (unsigned char)OC_CLAMPI(
                0,
                (tmp[0] - 9 * tmp[OC_MAXI(y - 2, 0) * c_w] +
                 35 * tmp[OC_MAXI(y - 1, 0) * c_w] + 114 * tmp[y * c_w] -
                 17 * tmp[OC_MINI(y + 1, c_h - 1) * c_w] +
                 4 * tmp[OC_MINI(y + 2, c_h - 1) * c_w] + 64) >>
                    7,
                255);
          }
          for (; y < c_h - 2; y++) {
            _dst[y * c_w] = (unsigned char)OC_CLAMPI(
                0,
                (tmp[(y - 3) * c_w] - 9 * tmp[(y - 2) * c_w] +
                 35 * tmp[(y - 1) * c_w] + 114 * tmp[y * c_w] -
                 17 * tmp[(y + 1) * c_w] + 4 * tmp[(y + 2) * c_w] + 64) >>
                    7,
                255);
          }
          for (; y < c_h; y++) {
            _dst[y * c_w] = (unsigned char)OC_CLAMPI(
                0,
                (tmp[(y - 3) * c_w] - 9 * tmp[(y - 2) * c_w] +
                 35 * tmp[(y - 1) * c_w] + 114 * tmp[y * c_w] -
                 17 * tmp[OC_MINI(y + 1, c_h - 1) * c_w] +
                 4 * tmp[(c_h - 1) * c_w] + 64) >>
                    7,
                255);
          }
          _dst++;
          tmp++;
        }
        _dst += c_sz - c_w;
        tmp -= c_w;
      } break;
      case 2: {
        /*Slide C_r down a quarter-pel.
          This is the same as the horizontal filter.*/
        for (x = 0; x < c_w; x++) {
          for (y = 0; y < OC_MINI(c_h, 2); y++) {
            _dst[y * c_w] = (unsigned char)OC_CLAMPI(
                0,
                (4 * tmp[0] - 17 * tmp[OC_MAXI(y - 1, 0) * c_w] +
                 114 * tmp[y * c_w] + 35 * tmp[OC_MINI(y + 1, c_h - 1) * c_w] -
                 9 * tmp[OC_MINI(y + 2, c_h - 1) * c_w] +
                 tmp[OC_MINI(y + 3, c_h - 1) * c_w] + 64) >>
                    7,
                255);
          }
          for (; y < c_h - 3; y++) {
            _dst[y * c_w] = (unsigned char)OC_CLAMPI(
                0,
                (4 * tmp[(y - 2) * c_w] - 17 * tmp[(y - 1) * c_w] +
                 114 * tmp[y * c_w] + 35 * tmp[(y + 1) * c_w] -
                 9 * tmp[(y + 2) * c_w] + tmp[(y + 3) * c_w] + 64) >>
                    7,
                255);
          }
          for (; y < c_h; y++) {
            _dst[y * c_w] = (unsigned char)OC_CLAMPI(
                0,
                (4 * tmp[(y - 2) * c_w] - 17 * tmp[(y - 1) * c_w] +
                 114 * tmp[y * c_w] + 35 * tmp[OC_MINI(y + 1, c_h - 1) * c_w] -
                 9 * tmp[OC_MINI(y + 2, c_h - 1) * c_w] + tmp[(c_h - 1) * c_w] +
                 64) >>
                    7,
                255);
          }
          _dst++;
          tmp++;
        }
      } break;
    }
    /*For actual interlaced material, this would have to be done separately on
       each field, and the shift amounts would be different.
      C_r moves down 1/8, C_b up 3/8 in the top field, and C_r moves down 3/8,
       C_b up 1/8 in the bottom field.
      The corresponding filters would be:
       Down 1/8 (reverse order for up): [3 -11 125 15 -4 0]/128
       Down 3/8 (reverse order for up): [4 -19 98 56 -13 2]/128*/
  }
}